

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall
soul::HEARTGenerator::createSeriesOfWrites
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> values)

{
  bool bVar1;
  EndpointDetails *pEVar2;
  Expression *pEVar3;
  ArrayElementRef *pAVar4;
  OutputEndpointRef *pOVar5;
  EndpointDeclaration *pEVar6;
  pool_ref<soul::AST::Expression> *ppVar7;
  Expression *pEVar8;
  OutputDeclaration *pOVar9;
  Constant *pCVar10;
  Expression *pEVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  SliceRange SVar12;
  CompileMessage local_2f0;
  pool_ptr<soul::heart::Expression> local_2b8;
  CodeLocation local_2b0;
  CodeLocation local_2a0;
  Expression *local_290;
  Expression *wrappedIndex;
  Type indexType;
  CodeLocation local_268;
  int64_t local_258;
  int64_t fixedIndex;
  undefined1 local_248 [4];
  uint arraySize;
  Value constIndex;
  Context *context;
  Expression *index;
  CodeLocation local_1f0;
  ulong local_1e0;
  ArraySize i;
  SliceRange slice;
  Expression *value;
  Type sampleType_1;
  pool_ref<soul::AST::Expression> v_1;
  pool_ref<soul::AST::Expression> *__end4;
  pool_ref<soul::AST::Expression> *__begin4;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> *__range4;
  EndpointDetails *local_150;
  EndpointDetails *details_1;
  pool_ptr<soul::AST::OutputEndpointRef> local_140;
  pool_ptr<soul::AST::OutputEndpointRef> outputRef;
  pool_ptr<soul::AST::ArrayElementRef> arraySubscript;
  undefined1 local_128 [24];
  undefined1 local_110 [8];
  Type sampleType;
  Type local_d8;
  string local_c0;
  CompileMessage local_a0;
  EndpointDetails *local_58;
  EndpointDetails *details;
  pool_ref<soul::AST::Expression> v;
  pool_ref<soul::AST::Expression> *__end3;
  pool_ref<soul::AST::Expression> *__begin3;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> *__range3;
  pool_ptr<soul::AST::OutputEndpointRef> output;
  Expression *target_local;
  HEARTGenerator *this_local;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> values_local;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values.e;
  this_local = (HEARTGenerator *)values.s;
  output.object = (OutputEndpointRef *)target;
  values_local.s = (pool_ref<soul::AST::Expression> *)args_1;
  cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&__range3,target);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&__range3);
  if (bVar1) {
    __end3 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::begin
                       ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
    v.object = (Expression *)
               ArrayView<soul::pool_ref<soul::AST::Expression>_>::end
                         ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
    for (; (Expression *)__end3 != v.object; __end3 = __end3 + 1) {
      details = (EndpointDetails *)__end3->object;
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->
                         ((pool_ptr<soul::AST::OutputEndpointRef> *)&__range3);
      pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
      pEVar2 = AST::EndpointDeclaration::getDetails(pEVar6);
      local_58 = pEVar2;
      pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&details);
      bVar1 = AST::EndpointDetails::supportsDataType(pEVar2,pEVar8);
      pEVar2 = local_58;
      if (!bVar1) {
        pEVar8 = &(output.object)->super_Expression;
        pEVar3 = pool_ref<soul::AST::Expression>::operator->
                           ((pool_ref<soul::AST::Expression> *)&details);
        (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_d8);
        Type::getDescription_abi_cxx11_(&local_c0,&local_d8);
        AST::EndpointDetails::getTypesDescription_abi_cxx11_
                  ((string *)&sampleType.structure,local_58);
        Errors::cannotWriteTypeToEndpoint<std::__cxx11::string,std::__cxx11::string>
                  (&local_a0,(Errors *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &sampleType.structure,args_1);
        AST::Context::throwError(&(pEVar8->super_Statement).super_ASTObject.context,&local_a0,false)
        ;
      }
      pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&details);
      AST::EndpointDetails::getDataType((Type *)local_110,pEVar2,pEVar8);
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->
                         ((pool_ptr<soul::AST::OutputEndpointRef> *)&__range3);
      CodeLocation::CodeLocation
                ((CodeLocation *)(local_128 + 8),
                 &(pOVar5->super_Expression).super_Statement.super_ASTObject.context.location);
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->
                         ((pool_ptr<soul::AST::OutputEndpointRef> *)&__range3);
      pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
      pOVar9 = pool_ptr<soul::heart::OutputDeclaration>::operator*(&pEVar6->generatedOutput);
      pool_ptr<soul::heart::Expression>::pool_ptr
                ((pool_ptr<soul::heart::Expression> *)local_128,(void *)0x0);
      pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&details);
      pEVar11 = evaluateAsExpression(this,pEVar8,(Type *)local_110);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
      BlockBuilder::addWriteStream
                (&(this->builder).super_BlockBuilder,(CodeLocation *)(local_128 + 8),pOVar9,
                 (pool_ptr<soul::heart::Expression> *)args_1,pEVar11);
      pool_ptr<soul::heart::Expression>::~pool_ptr((pool_ptr<soul::heart::Expression> *)local_128);
      CodeLocation::~CodeLocation((CodeLocation *)(local_128 + 8));
      Type::~Type((Type *)local_110);
      pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&details);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr
            ((pool_ptr<soul::AST::OutputEndpointRef> *)&__range3);
  if (bVar1) {
    return;
  }
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>
            ((soul *)&outputRef,&(output.object)->super_Expression);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&outputRef);
  if (bVar1) {
    pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                       ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
    details_1 = (EndpointDetails *)(pAVar4->object).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>
              ((soul *)&local_140,(pool_ptr<soul::AST::Expression> *)&details_1);
    pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&details_1);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_140);
    if (bVar1) {
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
      pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
      local_150 = AST::EndpointDeclaration::getDetails(pEVar6);
      bVar1 = pool_ptr<soul::AST::Expression>::operator==(&local_150->arraySize,(void *)0x0);
      if (bVar1) {
        pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                           ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
        Errors::cannotUseBracketsOnNonArrayEndpoint<>();
        AST::Context::throwError
                  (&(pAVar4->super_Expression).super_Statement.super_ASTObject.context,
                   (CompileMessage *)&__range4,false);
      }
      __end4 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::begin
                         ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
      ppVar7 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::end
                         ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&this_local);
      for (; pEVar2 = local_150, __end4 != ppVar7; __end4 = __end4 + 1) {
        sampleType_1.structure.object = (Structure *)__end4->object;
        pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&sampleType_1.structure);
        AST::EndpointDetails::getElementDataType((Type *)&value,pEVar2,pEVar8);
        pEVar8 = pool_ref::operator_cast_to_Expression_((pool_ref *)&sampleType_1.structure);
        slice.end = (ArraySize)evaluateAsExpression(this,pEVar8,(Type *)&value);
        pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                           ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
        if ((pAVar4->isSlice & 1U) == 0) {
          pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                             ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
          pEVar8 = pool_ptr<soul::AST::Expression>::operator*(&pAVar4->startIndex);
          pEVar11 = evaluateAsExpression(this,pEVar8);
          pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                             ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
          pEVar8 = pool_ptr<soul::AST::Expression>::operator->(&pAVar4->startIndex);
          constIndex.allocatedData.allocatedData.space[0] =
               (uint64_t)&(pEVar8->super_Statement).super_ASTObject.context;
          (*(pEVar11->super_Object)._vptr_Object[7])(local_248);
          pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
          pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
          pOVar9 = pool_ptr<soul::heart::OutputDeclaration>::operator->(&pEVar6->generatedOutput);
          fixedIndex._0_4_ = 1;
          fixedIndex._4_4_ =
               std::optional<unsigned_int>::value_or<int>
                         (&(pOVar9->super_IODeclaration).arraySize,(int *)&fixedIndex);
          bVar1 = soul::Value::isValid((Value *)local_248);
          if (bVar1) {
            local_258 = TypeRules::checkAndGetArrayIndex<soul::AST::Context&>
                                  ((Context *)constIndex.allocatedData.allocatedData.space[0],
                                   (Value *)local_248);
            TypeRules::checkConstantArrayIndex<soul::AST::Context&>
                      ((Context *)constIndex.allocatedData.allocatedData.space[0],local_258,
                       (ulong)fixedIndex._4_4_);
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            CodeLocation::CodeLocation(&local_268,&(pEVar6->super_ASTObject).context.location);
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            pOVar9 = pool_ptr<soul::heart::OutputDeclaration>::operator*(&pEVar6->generatedOutput);
            pCVar10 = BlockBuilder::createConstantInt32<long>
                                (&(this->builder).super_BlockBuilder,local_258);
            pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Constant,void>
                      ((pool_ptr<soul::heart::Expression> *)&indexType.structure,pCVar10);
            BlockBuilder::addWriteStream
                      (&(this->builder).super_BlockBuilder,&local_268,pOVar9,
                       (pool_ptr<soul::heart::Expression> *)&indexType.structure,
                       (Expression *)slice.end);
            pool_ptr<soul::heart::Expression>::~pool_ptr
                      ((pool_ptr<soul::heart::Expression> *)&indexType.structure);
            CodeLocation::~CodeLocation(&local_268);
          }
          else {
            Type::createWrappedInt((Type *)&wrappedIndex,fixedIndex._4_4_);
            CodeLocation::CodeLocation
                      (&local_2a0,(CodeLocation *)constIndex.allocatedData.allocatedData.space[0]);
            pEVar11 = BlockBuilder::createCast
                                (&(this->builder).super_BlockBuilder,&local_2a0,pEVar11,
                                 (Type *)&wrappedIndex);
            CodeLocation::~CodeLocation(&local_2a0);
            local_290 = pEVar11;
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            CodeLocation::CodeLocation(&local_2b0,&(pEVar6->super_ASTObject).context.location);
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            pOVar9 = pool_ptr<soul::heart::OutputDeclaration>::operator*(&pEVar6->generatedOutput);
            pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>
                      (&local_2b8,local_290);
            BlockBuilder::addWriteStream
                      (&(this->builder).super_BlockBuilder,&local_2b0,pOVar9,&local_2b8,
                       (Expression *)slice.end);
            pool_ptr<soul::heart::Expression>::~pool_ptr(&local_2b8);
            CodeLocation::~CodeLocation(&local_2b0);
            Type::~Type((Type *)&wrappedIndex);
          }
          soul::Value::~Value((Value *)local_248);
          SVar12.end = slice.start;
          SVar12.start = local_1e0;
        }
        else {
          pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                             ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
          SVar12 = AST::ArrayElementRef::getResolvedSliceRange(pAVar4);
          i = SVar12.start;
          while( true ) {
            slice.start = SVar12.end;
            local_1e0 = SVar12.start;
            if (slice.start <= local_1e0) break;
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            CodeLocation::CodeLocation(&local_1f0,&(pEVar6->super_ASTObject).context.location);
            pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_140);
            pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
            pOVar9 = pool_ptr<soul::heart::OutputDeclaration>::operator*(&pEVar6->generatedOutput);
            pCVar10 = BlockBuilder::createConstantInt32<unsigned_long>
                                (&(this->builder).super_BlockBuilder,local_1e0);
            pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Constant,void>
                      ((pool_ptr<soul::heart::Expression> *)&index,pCVar10);
            BlockBuilder::addWriteStream
                      (&(this->builder).super_BlockBuilder,&local_1f0,pOVar9,
                       (pool_ptr<soul::heart::Expression> *)&index,(Expression *)slice.end);
            pool_ptr<soul::heart::Expression>::~pool_ptr
                      ((pool_ptr<soul::heart::Expression> *)&index);
            CodeLocation::~CodeLocation(&local_1f0);
            SVar12.end = slice.start;
            SVar12.start = local_1e0 + 1;
          }
        }
        slice.start = SVar12.end;
        local_1e0 = SVar12.start;
        Type::~Type((Type *)&value);
        pool_ref<soul::AST::Expression>::~pool_ref
                  ((pool_ref<soul::AST::Expression> *)&sampleType_1.structure);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr(&local_140);
    if (bVar1) goto LAB_004aec47;
  }
  bVar1 = false;
LAB_004aec47:
  pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr
            ((pool_ptr<soul::AST::ArrayElementRef> *)&outputRef);
  if (bVar1) {
    return;
  }
  pEVar8 = &(output.object)->super_Expression;
  Errors::targetMustBeOutput<>();
  AST::Context::throwError(&(pEVar8->super_Statement).super_ASTObject.context,&local_2f0,false);
}

Assistant:

void createSeriesOfWrites (AST::Expression& target, ArrayView<pool_ref<AST::Expression>> values)
    {
        // Two choices - the target can be an output declaration, or an element of an output declaration
        if (auto output = cast<AST::OutputEndpointRef> (target))
        {
            for (auto v : values)
            {
                const auto& details = output->output->getDetails();

                if (! details.supportsDataType (v))
                    target.context.throwError (Errors::cannotWriteTypeToEndpoint (v->getResultType().getDescription(),
                                                                                  details.getTypesDescription()));

                auto sampleType = details.getDataType (v);

                builder.addWriteStream (output->context.location,
                                        *output->output->generatedOutput, nullptr,
                                        evaluateAsExpression (v, sampleType));
            }

            return;
        }

        if (auto arraySubscript = cast<AST::ArrayElementRef> (target))
        {
            if (auto outputRef = cast<AST::OutputEndpointRef> (arraySubscript->object))
            {
                const auto& details = outputRef->output->getDetails();

                if (details.arraySize == nullptr)
                    arraySubscript->context.throwError (Errors::cannotUseBracketsOnNonArrayEndpoint());

                for (auto v : values)
                {
                    // Find the element type that our expression will write to
                    auto sampleType = details.getElementDataType (v);
                    auto& value = evaluateAsExpression (v, sampleType);

                    if (arraySubscript->isSlice)
                    {
                        auto slice = arraySubscript->getResolvedSliceRange();

                        for (auto i = slice.start; i < slice.end; ++i)
                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (i), value);
                    }
                    else
                    {
                        auto& index = evaluateAsExpression (*arraySubscript->startIndex);
                        auto& context = arraySubscript->startIndex->context;
                        auto constIndex = index.getAsConstant();
                        auto arraySize = outputRef->output->generatedOutput->arraySize.value_or (1);

                        if (constIndex.isValid())
                        {
                            auto fixedIndex = TypeRules::checkAndGetArrayIndex (context, constIndex);
                            TypeRules::checkConstantArrayIndex (context, fixedIndex, (Type::ArraySize) arraySize);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput,
                                                    builder.createConstantInt32 (fixedIndex), value);
                        }
                        else
                        {
                            auto indexType = Type::createWrappedInt ((Type::BoundedIntSize) arraySize);
                            auto& wrappedIndex = builder.createCast (context.location, index, indexType);

                            builder.addWriteStream (outputRef->output->context.location,
                                                    *outputRef->output->generatedOutput, wrappedIndex, value);
                        }
                    }
                }

                return;
            }
        }

        target.context.throwError (Errors::targetMustBeOutput());
    }